

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

void __thiscall polyscope::TransformationGizmo::draw(TransformationGizmo *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  mat4 *pmVar5;
  element_type *peVar6;
  double dVar7;
  uint *puVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  undefined1 auVar47 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  vec4 vVar57;
  mat4 projMat;
  mat4 viewMat;
  mat4 Pinv;
  mat4 P;
  uint local_3a0;
  uint local_39c;
  undefined8 local_398;
  undefined8 local_390;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_384;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_380;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_37c;
  float local_378;
  undefined4 uStack_374;
  undefined8 uStack_370;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  
  if ((this->enabled).value == true) {
    if ((this->ringProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prepare(this);
    }
    pmVar5 = this->T;
    local_380 = pmVar5->value[0].field_0;
    local_384 = pmVar5->value[0].field_1;
    local_37c = pmVar5->value[0].field_2;
    dVar7 = (double)this->gizmoSizeRel * state::lengthScale;
    uStack_374 = (undefined4)((ulong)dVar7 >> 0x20);
    local_378 = (float)dVar7;
    uStack_370 = 0;
    view::getCameraViewMatrix();
    pmVar5 = this->T;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_130;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_120;
    auVar30._4_4_ = uStack_374;
    auVar30._0_4_ = local_378;
    auVar30._8_8_ = uStack_370;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_110;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_100;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_128;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_118;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_108;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_f8;
    fVar1 = pmVar5->value[0].field_1.y;
    fVar2 = pmVar5->value[0].field_0.x;
    fVar3 = pmVar5->value[0].field_2.z;
    fVar4 = pmVar5->value[0].field_3.w;
    auVar10 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[1].field_1));
    auVar11 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[1].field_0));
    auVar12 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[1].field_2));
    auVar13 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[1].field_3));
    auVar14 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[2].field_1));
    auVar15 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[2].field_0));
    auVar16 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[2].field_3));
    auVar17 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[3].field_0));
    auVar18 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[3].field_1));
    auVar19 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[3].field_2));
    auVar20 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[3].field_3));
    auVar21 = vmulss_avx512f(auVar30,ZEXT816(0) << 0x40);
    auVar51._0_4_ = auVar21._0_4_;
    auVar51._4_4_ = auVar51._0_4_;
    auVar51._8_4_ = auVar51._0_4_;
    auVar51._12_4_ = auVar51._0_4_;
    auVar21 = vmulps_avx512vl(auVar27,auVar10);
    auVar22 = vmulps_avx512vl(auVar27,auVar14);
    auVar23 = vmulps_avx512vl(auVar47,auVar16);
    auVar24 = vmulps_avx512vl(auVar27,auVar18);
    auVar10 = vmulps_avx512vl(auVar25,auVar10);
    auVar14 = vmulps_avx512vl(auVar25,auVar14);
    auVar18 = vmulps_avx512vl(auVar25,auVar18);
    auVar36._0_4_ =
         fVar2 * (float)local_130 + fVar1 * (float)local_120 + (float)local_110 * fVar3 +
         (float)local_100 * fVar4;
    auVar36._4_4_ =
         fVar2 * (float)(local_130 >> 0x20) + fVar1 * (float)(local_120 >> 0x20) +
         (float)(local_110 >> 0x20) * fVar3 + (float)(local_100 >> 0x20) * fVar4;
    auVar36._8_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 0.0 + fVar4 * 0.0;
    auVar36._12_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 0.0 + fVar4 * 0.0;
    auVar25 = vmulps_avx512vl(auVar40,auVar11);
    auVar52._0_4_ =
         fVar2 * (float)local_128 + fVar1 * (float)local_118 + fVar3 * (float)local_108 +
         fVar4 * (float)local_f8;
    auVar52._4_4_ =
         fVar2 * (float)(local_128 >> 0x20) + fVar1 * (float)(local_118 >> 0x20) +
         fVar3 * (float)(local_108 >> 0x20) + fVar4 * (float)(local_f8 >> 0x20);
    auVar52._8_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 0.0 + fVar4 * 0.0;
    auVar52._12_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 0.0 + fVar4 * 0.0;
    auVar26 = vmulps_avx512vl(auVar37,auVar11);
    auVar11 = vxorps_avx512vl(auVar11,auVar11);
    auVar27 = vmulps_avx512vl(auVar42,auVar12);
    auVar12 = vmulps_avx512vl(auVar38,auVar12);
    auVar28 = vmulps_avx512vl(auVar36,auVar11);
    auVar29 = vmulps_avx512vl(auVar47,auVar13);
    auVar13 = vmulps_avx512vl(auVar39,auVar13);
    auVar35._0_4_ = auVar29._0_4_ + auVar27._0_4_ + auVar21._0_4_ + auVar25._0_4_;
    auVar35._4_4_ = auVar29._4_4_ + auVar27._4_4_ + auVar21._4_4_ + auVar25._4_4_;
    auVar35._8_4_ = auVar29._8_4_ + auVar27._8_4_ + auVar21._8_4_ + auVar25._8_4_;
    auVar35._12_4_ = auVar29._12_4_ + auVar27._12_4_ + auVar21._12_4_ + auVar25._12_4_;
    auVar21 = vmulps_avx512vl(auVar40,auVar15);
    auVar29._0_4_ = auVar26._0_4_ + auVar10._0_4_ + auVar12._0_4_ + auVar13._0_4_;
    auVar29._4_4_ = auVar26._4_4_ + auVar10._4_4_ + auVar12._4_4_ + auVar13._4_4_;
    auVar29._8_4_ = auVar26._8_4_ + auVar10._8_4_ + auVar12._8_4_ + auVar13._8_4_;
    auVar29._12_4_ = auVar26._12_4_ + auVar10._12_4_ + auVar12._12_4_ + auVar13._12_4_;
    auVar10 = vmulps_avx512vl(auVar37,auVar15);
    auVar12 = vmulps_avx512vl(auVar40,auVar17);
    auVar13 = vmulps_avx512vl(auVar37,auVar17);
    auVar15 = vaddps_avx512vl(auVar21,auVar22);
    auVar17 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar5->value[2].field_2));
    auVar21 = vmulps_avx512vl(auVar35,auVar11);
    auVar22 = vmulps_avx512vl(auVar42,auVar19);
    auVar19 = vmulps_avx512vl(auVar38,auVar19);
    auVar25 = vmulps_avx512vl(auVar29,auVar11);
    auVar21 = vaddps_avx512vl(auVar28,auVar21);
    auVar26._0_4_ = auVar12._0_4_ + auVar24._0_4_ + auVar22._0_4_;
    auVar26._4_4_ = auVar12._4_4_ + auVar24._4_4_ + auVar22._4_4_;
    auVar26._8_4_ = auVar12._8_4_ + auVar24._8_4_ + auVar22._8_4_;
    auVar26._12_4_ = auVar12._12_4_ + auVar24._12_4_ + auVar22._12_4_;
    auVar12 = vmulps_avx512vl(auVar47,auVar20);
    auVar20 = vmulps_avx512vl(auVar39,auVar20);
    auVar12 = vaddps_avx512vl(auVar26,auVar12);
    auVar30 = vbroadcastss_avx512vl(auVar30);
    auVar22 = vmulps_avx512vl(auVar51,auVar35);
    auVar24._0_4_ = auVar13._0_4_ + auVar18._0_4_ + auVar19._0_4_ + auVar20._0_4_;
    auVar24._4_4_ = auVar13._4_4_ + auVar18._4_4_ + auVar19._4_4_ + auVar20._4_4_;
    auVar24._8_4_ = auVar13._8_4_ + auVar18._8_4_ + auVar19._8_4_ + auVar20._8_4_;
    auVar24._12_4_ = auVar13._12_4_ + auVar18._12_4_ + auVar19._12_4_ + auVar20._12_4_;
    fVar1 = auVar30._0_4_;
    auVar18._0_4_ = auVar36._0_4_ * fVar1;
    fVar2 = auVar30._4_4_;
    auVar18._4_4_ = auVar36._4_4_ * fVar2;
    fVar3 = auVar30._8_4_;
    auVar18._8_4_ = auVar36._8_4_ * fVar3;
    fVar4 = auVar30._12_4_;
    auVar18._12_4_ = auVar36._12_4_ * fVar4;
    auVar19._0_4_ = auVar51._0_4_ * auVar36._0_4_;
    auVar19._4_4_ = auVar51._0_4_ * auVar36._4_4_;
    auVar19._8_4_ = auVar51._0_4_ * auVar36._8_4_;
    auVar19._12_4_ = auVar51._0_4_ * auVar36._12_4_;
    auVar30 = vmulps_avx512vl(auVar42,auVar17);
    auVar13 = vmulps_avx512vl(auVar38,auVar17);
    auVar17 = vmulps_avx512vl(auVar51,auVar12);
    auVar18 = vaddps_avx512vl(auVar18,auVar22);
    auVar30 = vaddps_avx512vl(auVar15,auVar30);
    auVar15 = vmulps_avx512vl(auVar39,auVar16);
    auVar30 = vaddps_avx512vl(auVar30,auVar23);
    auVar16._0_4_ = auVar10._0_4_ + auVar14._0_4_ + auVar13._0_4_ + auVar15._0_4_;
    auVar16._4_4_ = auVar10._4_4_ + auVar14._4_4_ + auVar13._4_4_ + auVar15._4_4_;
    auVar16._8_4_ = auVar10._8_4_ + auVar14._8_4_ + auVar13._8_4_ + auVar15._8_4_;
    auVar16._12_4_ = auVar10._12_4_ + auVar14._12_4_ + auVar13._12_4_ + auVar15._12_4_;
    fVar53 = auVar51._0_4_ * auVar24._0_4_;
    fVar54 = auVar51._0_4_ * auVar24._4_4_;
    fVar55 = auVar51._0_4_ * auVar24._8_4_;
    fVar56 = auVar51._0_4_ * auVar24._12_4_;
    auVar10 = vmulps_avx512vl(auVar30,auVar11);
    fVar41 = auVar51._0_4_ * auVar30._0_4_;
    fVar43 = auVar51._0_4_ * auVar30._4_4_;
    fVar44 = auVar51._0_4_ * auVar30._8_4_;
    fVar45 = auVar51._0_4_ * auVar30._12_4_;
    auVar14._0_4_ = auVar30._0_4_ * fVar1;
    auVar14._4_4_ = auVar30._4_4_ * fVar2;
    auVar14._8_4_ = auVar30._8_4_ * fVar3;
    auVar14._12_4_ = auVar30._12_4_ * fVar4;
    auVar30 = vaddps_avx512vl(auVar21,auVar10);
    auVar10 = vmulps_avx512vl(auVar52,auVar11);
    auVar11 = vmulps_avx512vl(auVar16,auVar11);
    auVar10 = vaddps_avx512vl(auVar10,auVar25);
    fVar46 = auVar17._0_4_;
    fVar48 = auVar17._4_4_;
    fVar49 = auVar17._8_4_;
    fVar50 = auVar17._12_4_;
    auVar13._0_4_ =
         fVar53 + auVar52._0_4_ * fVar1 + auVar51._0_4_ * auVar29._0_4_ +
                  auVar51._0_4_ * auVar16._0_4_;
    auVar13._4_4_ =
         fVar54 + auVar52._4_4_ * fVar2 + auVar51._0_4_ * auVar29._4_4_ +
                  auVar51._0_4_ * auVar16._4_4_;
    auVar13._8_4_ =
         fVar55 + auVar52._8_4_ * fVar3 + auVar51._0_4_ * auVar29._8_4_ +
                  auVar51._0_4_ * auVar16._8_4_;
    auVar13._12_4_ =
         fVar56 + auVar52._12_4_ * fVar4 + auVar51._0_4_ * auVar29._12_4_ +
                  auVar51._0_4_ * auVar16._12_4_;
    auVar32 = vbroadcasti64x4_avx512f(_DAT_0029b3a0);
    auVar30 = vaddps_avx512vl(auVar30,auVar12);
    auVar10 = vaddps_avx512vl(auVar10,auVar11);
    auVar12._0_4_ =
         fVar53 + auVar16._0_4_ * fVar1 +
                  auVar51._0_4_ * auVar52._0_4_ + auVar51._0_4_ * auVar29._0_4_;
    auVar12._4_4_ =
         fVar54 + auVar16._4_4_ * fVar2 +
                  auVar51._0_4_ * auVar52._4_4_ + auVar51._0_4_ * auVar29._4_4_;
    auVar12._8_4_ =
         fVar55 + auVar16._8_4_ * fVar3 +
                  auVar51._0_4_ * auVar52._8_4_ + auVar51._0_4_ * auVar29._8_4_;
    auVar12._12_4_ =
         fVar56 + auVar16._12_4_ * fVar4 +
                  auVar51._0_4_ * auVar52._12_4_ + auVar51._0_4_ * auVar29._12_4_;
    auVar10 = vaddps_avx512vl(auVar10,auVar24);
    auVar11 = vaddps_avx512vl(auVar19,auVar22);
    auVar11 = vaddps_avx512vl(auVar11,auVar14);
    auVar33 = vinsertf32x4_avx512f(ZEXT1664(auVar30),auVar10,1);
    auVar10._0_4_ =
         fVar53 + auVar51._0_4_ * auVar52._0_4_ + auVar29._0_4_ * fVar1 +
                  auVar51._0_4_ * auVar16._0_4_;
    auVar10._4_4_ =
         fVar54 + auVar51._0_4_ * auVar52._4_4_ + auVar29._4_4_ * fVar2 +
                  auVar51._0_4_ * auVar16._4_4_;
    auVar10._8_4_ =
         fVar55 + auVar51._0_4_ * auVar52._8_4_ + auVar29._8_4_ * fVar3 +
                  auVar51._0_4_ * auVar16._8_4_;
    auVar10._12_4_ =
         fVar56 + auVar51._0_4_ * auVar52._12_4_ + auVar29._12_4_ * fVar4 +
                  auVar51._0_4_ * auVar16._12_4_;
    auVar34 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar11._12_4_ + fVar50,
                                            CONCAT48(auVar11._8_4_ + fVar49,
                                                     CONCAT44(auVar11._4_4_ + fVar48,
                                                              auVar11._0_4_ + fVar46)))),auVar12,1);
    auVar32 = vpermi2pd_avx512f(auVar32,auVar34,auVar33);
    auVar33 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(fVar50 + fVar45 + auVar19._12_4_ +
                                                              auVar35._12_4_ * fVar4,
                                            CONCAT48(fVar49 + fVar44 + auVar19._8_4_ +
                                                                       auVar35._8_4_ * fVar3,
                                                     CONCAT44(fVar48 + fVar43 + auVar19._4_4_ +
                                                                                auVar35._4_4_ *
                                                                                fVar2,
                                                              fVar46 + fVar41 + auVar19._0_4_ +
                                                                                auVar35._0_4_ *
                                                                                fVar1)))),auVar10,1)
    ;
    auVar34 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(fVar50 + fVar45 + auVar18._12_4_,
                                            CONCAT48(fVar49 + fVar44 + auVar18._8_4_,
                                                     CONCAT44(fVar48 + fVar43 + auVar18._4_4_,
                                                              fVar46 + fVar41 + auVar18._0_4_)))),
                         auVar13,1);
    auVar31 = vpermi2pd_avx512vl(_DAT_0029b3c0,auVar34._0_32_,auVar33._0_32_);
    local_f0 = vinsertf64x4_avx512f(auVar32,auVar31,0);
    peVar6 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"u_modelView","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,(string *)local_150,local_f0);
    if (local_150[0] != local_140) {
      operator_delete(local_150[0]);
    }
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"u_modelView","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,(string *)local_170,local_f0);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0]);
    }
    peVar6 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"u_modelView","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,(string *)local_190,local_f0);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    view::getCameraPerspectiveMatrix();
    peVar6 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b0[0] = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"u_projMatrix","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,local_1b0,&local_130);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"u_projMatrix","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,local_1d0,&local_130);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    peVar6 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"u_projMatrix","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,local_1f0,&local_130);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    peVar6 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"u_diskWidthRel","");
    (*peVar6->_vptr_ShaderProgram[5])((ulong)(uint)this->diskWidthObj,peVar6,local_210);
    if (local_210[0] != local_200) {
      operator_delete(local_210[0]);
    }
    local_390 = 0;
    local_39c = 0;
    local_398 = 0;
    local_3a0 = 0;
    if (this->selectedType == Rotation) {
      if (this->selectedDim == 2) {
        puVar8 = &local_39c;
      }
      else if (this->selectedDim == 1) {
        puVar8 = (uint *)((long)&local_390 + 4);
      }
      else {
        puVar8 = (uint *)&local_390;
      }
      *puVar8 = 0x3f800000;
    }
    peVar6 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_230[0] = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"u_active","");
    (*peVar6->_vptr_ShaderProgram[9])(local_390,(ulong)local_39c,peVar6,local_230);
    if (local_230[0] != local_220) {
      operator_delete(local_230[0]);
    }
    if (this->selectedType == Translation) {
      if (this->selectedDim == 2) {
        puVar8 = &local_3a0;
      }
      else if (this->selectedDim == 1) {
        puVar8 = (uint *)((long)&local_398 + 4);
      }
      else {
        puVar8 = (uint *)&local_398;
      }
      *puVar8 = 0x3f800000;
    }
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"u_active","");
    (*peVar6->_vptr_ShaderProgram[9])(local_398,(ulong)local_3a0,peVar6,local_250);
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    bVar9 = this->selectedType == Scale;
    if (bVar9) {
      uStack_35c = 0x3f733333;
      local_368 = 0x3f733333;
      uStack_364 = 0x3f733333;
      uStack_360 = 0x3f733333;
    }
    else {
      uStack_35c = 0x3f59999a;
      local_368 = 0x3f59999a;
      uStack_364 = 0x3f59999a;
      uStack_360 = 0x3f59999a;
    }
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_70);
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"u_invProjMatrix","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,local_270,local_b0);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"u_viewport","");
    vVar57 = render::Engine::getCurrentViewport(render::engine);
    (*peVar6->_vptr_ShaderProgram[10])(vVar57._0_8_,vVar57._8_8_,peVar6,local_290);
    if (local_290[0] != local_280) {
      operator_delete(local_290[0]);
    }
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2b0[0] = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"u_lengthMult","");
    (*peVar6->_vptr_ShaderProgram[5])((ulong)(uint)this->vecLength,peVar6,local_2b0);
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0]);
    }
    peVar6 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"u_radius","");
    auVar30 = ZEXT416((uint)(local_380.x * local_380.x + local_384.y * local_384.y +
                            local_37c.z * local_37c.z));
    auVar30 = vsqrtss_avx(auVar30,auVar30);
    local_378 = auVar30._0_4_ * local_378;
    (*peVar6->_vptr_ShaderProgram[6])((double)local_378 * 0.2,peVar6,local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0]);
    }
    peVar6 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2f0[0] = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"u_invProjMatrix","");
    (*peVar6->_vptr_ShaderProgram[7])(peVar6,local_2f0,local_b0);
    if (local_2f0[0] != local_2e0) {
      operator_delete(local_2f0[0]);
    }
    peVar6 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"u_viewport","");
    vVar57 = render::Engine::getCurrentViewport(render::engine);
    (*peVar6->_vptr_ShaderProgram[10])(vVar57._0_8_,vVar57._8_8_,peVar6,local_310);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0]);
    }
    peVar6 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"u_pointRadius","");
    (*peVar6->_vptr_ShaderProgram[5])((ulong)(uint)(local_378 * this->sphereRad),peVar6,local_330);
    if (local_330[0] != local_320) {
      operator_delete(local_330[0]);
    }
    peVar6 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"u_baseColor","");
    (*peVar6->_vptr_ShaderProgram[9])
              (CONCAT44(uStack_364,local_368),
               (ulong)((uint)bVar9 * 0x3f733333 + (uint)!bVar9 * 0x3f59999a),peVar6,local_350);
    if (local_350[0] != local_340) {
      operator_delete(local_350[0]);
    }
    (*render::engine->_vptr_Engine[10])(render::engine,0);
    (*render::engine->_vptr_Engine[0xb])(render::engine,0);
    (*render::engine->_vptr_Engine[0xd])(render::engine,0);
    (*((this->ringProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (*((this->arrowProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (*((this->sphereProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void TransformationGizmo::draw() {
  if (!enabled.get()) return;
  if (!ringProgram) prepare();

  // == set uniforms

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSizePreTrans = gizmoSizeRel * state::lengthScale;
  float gizmoSize = transScale * gizmoSizePreTrans;

  glm::mat4 viewMat =
      view::getCameraViewMatrix() * T * glm::scale(glm::vec3{gizmoSizePreTrans, gizmoSizePreTrans, gizmoSizePreTrans});
  ringProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  arrowProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  sphereProgram->setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  ringProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  arrowProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  sphereProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  ringProgram->setUniform("u_diskWidthRel", diskWidthObj);

  // set selections
  glm::vec3 selectRot{0., 0., 0.};
  glm::vec3 selectTrans{0., 0., 0.};
  glm::vec3 sphereColor(0.85);
  if (selectedType == TransformHandle::Rotation) {
    selectRot[selectedDim] = 1.;
  }
  ringProgram->setUniform("u_active", selectRot);
  if (selectedType == TransformHandle::Translation) {
    selectTrans[selectedDim] = 1.;
  }
  arrowProgram->setUniform("u_active", selectTrans);
  if (selectedType == TransformHandle::Scale) {
    sphereColor = glm::vec3(0.95);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  arrowProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  arrowProgram->setUniform("u_viewport", render::engine->getCurrentViewport());
  arrowProgram->setUniform("u_lengthMult", vecLength);
  arrowProgram->setUniform("u_radius", 0.2 * gizmoSize);

  sphereProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  sphereProgram->setUniform("u_viewport", render::engine->getCurrentViewport());

  sphereProgram->setUniform("u_pointRadius", sphereRad * gizmoSize);
  sphereProgram->setUniform("u_baseColor", sphereColor);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBlendMode();
  render::engine->setBackfaceCull(false);

  // == draw

  ringProgram->draw();
  arrowProgram->draw();
  sphereProgram->draw();
}